

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memutil.cc
# Opt level: O2

char * absl::strings_internal::memmatch(char *phaystack,size_t haylen,char *pneedle,size_t neelen)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  
  if (neelen != 0) {
    if (neelen <= haylen) {
      cVar1 = *pneedle;
      pcVar3 = phaystack;
      while (pcVar3 = (char *)memchr(pcVar3,(int)cVar1,
                                     (size_t)(phaystack + (((haylen - neelen) + 1) - (long)pcVar3)))
            , pcVar3 != (char *)0x0) {
        iVar2 = bcmp(pcVar3,pneedle,neelen);
        if (iVar2 == 0) {
          return pcVar3;
        }
        pcVar3 = pcVar3 + 1;
      }
    }
    phaystack = (char *)0x0;
  }
  return phaystack;
}

Assistant:

const char* memmatch(const char* phaystack, size_t haylen, const char* pneedle,
                     size_t neelen) {
  if (0 == neelen) {
    return phaystack;  // even if haylen is 0
  }
  if (haylen < neelen) return nullptr;

  const char* match;
  const char* hayend = phaystack + haylen - neelen + 1;
  // A static cast is used here to work around the fact that memchr returns
  // a void* on Posix-compliant systems and const void* on Windows.
  while ((match = static_cast<const char*>(
              memchr(phaystack, pneedle[0], hayend - phaystack)))) {
    if (memcmp(match, pneedle, neelen) == 0)
      return match;
    else
      phaystack = match + 1;
  }
  return nullptr;
}